

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

ssize_t __thiscall r_comp::Compiler::read(Compiler *this,int __fd,void *__buf,size_t __nbytes)

{
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Iteration IVar2;
  uint uVar3;
  Class *pCVar4;
  code *pcVar5;
  size_t __nbytes_00;
  void *__buf_00;
  void *__buf_01;
  long extraout_RDX;
  long extraout_RDX_00;
  int __fd_00;
  undefined4 in_register_00000034;
  undefined2 in_R8W;
  undefined8 in_R9;
  long *plVar6;
  undefined1 in_stack_00000008;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_40;
  Metadata *metadata;
  
  metadata = this->_metadata;
  __nbytes_00 = __nbytes;
  pCVar4 = StructureMember::get_class((StructureMember *)__buf,metadata);
  __fd_00 = (int)metadata;
  if (pCVar4 == (Class *)0x0) {
    p_Var1 = &local_40;
    pcVar5 = (code *)StructureMember::read((StructureMember *)__buf,__fd_00,__buf_00,__nbytes_00);
    plVar6 = (long *)((long)&(this->error)._M_dataplus._M_p + extraout_RDX_00);
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *plVar6 + -1);
    }
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(in_register_00000034,__fd));
    uVar3 = (*pcVar5)(plVar6,&local_40,__nbytes & 0xff,0,in_R8W,in_R9,in_stack_00000008);
  }
  else {
    IVar2 = StructureMember::getIteration((StructureMember *)__buf);
    pCVar4->use_as = IVar2;
    pcVar5 = (code *)StructureMember::read((StructureMember *)__buf,__fd_00,__buf_01,__nbytes_00);
    plVar6 = (long *)((long)&(this->error)._M_dataplus._M_p + extraout_RDX);
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *plVar6 + -1);
    }
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               (__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(in_register_00000034,__fd));
    uVar3 = (*pcVar5)(plVar6,&local_50,__nbytes & 0xff,pCVar4,in_R8W,in_R9,in_stack_00000008);
    p_Var1 = &local_50;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
  return (ulong)uVar3;
}

Assistant:

bool Compiler::read(RepliStruct::Ptr node, const StructureMember &m, bool enforce, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (Class *p = m.get_class(_metadata)) {
        p->use_as = m.getIteration();
        return (this->*m.read())(node, enforce, p, write_index, extent_index, write);
    }

    return (this->*m.read())(node, enforce, nullptr, write_index, extent_index, write);
}